

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O3

void __thiscall
rsg::ComputeLessOrEqualRange::operator()
          (ComputeLessOrEqualRange *this,Random *rnd,bool dstMin,bool dstMax,float *aMin,float *aMax
          ,float *bMin,float *bMax)

{
  deUint32 dVar1;
  float aLen;
  float fVar2;
  float fVar3;
  float fVar4;
  
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  fVar2 = (float)(dVar1 % 0x21) * 0.25 + 0.0;
  dVar1 = deRandom_getUint32(&rnd->m_rnd);
  fVar3 = (float)(dVar1 % 0x21) * 0.25 + -4.0;
  fVar4 = fVar2 + fVar3;
  if (dstMax && !dstMin) {
    *aMin = fVar3;
    *aMax = fVar4;
  }
  else {
    dVar1 = deRandom_getUint32(&rnd->m_rnd);
    fVar2 = (float)(int)(dVar1 % ((int)((8.0 - fVar2) * 4.0) + 1U)) * 0.25 + 0.0;
    if (dstMin && dstMax) {
      *aMax = fVar3;
      *aMin = fVar3 - fVar2;
    }
    else {
      *aMin = fVar4 + 0.25;
      *aMax = fVar4 + 0.25 + fVar2;
    }
  }
  *bMin = fVar3;
  *bMax = fVar4;
  return;
}

Assistant:

void ComputeLessOrEqualRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin;
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax + getStep<T>();
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}